

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O3

uintptr_t upb_Message_GetTaggedMessagePtr
                    (upb_Message *msg,upb_MiniTableField *f,upb_Message *default_val)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  
  bVar1 = f->descriptortype_dont_copy_me__upb_internal_use_only;
  bVar2 = f->mode_dont_copy_me__upb_internal_use_only;
  if ((bVar2 & 0x10) == 0) {
    if ((bVar1 & 0xfe) == 10) {
      if (bVar2 < 0xc0) {
        __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_8Byte"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                      ,0x1bf,
                      "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                     );
      }
      if ((bVar2 & 3) != 2) {
        __assert_fail("upb_MiniTableField_IsScalar(f)",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                      ,0x1c0,
                      "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
                     );
      }
      if ((bVar2 & 8) != 0) {
        __assert_fail("!upb_MiniTableField_IsExtension(field)",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                      ,0x10d,
                      "void _upb_Message_GetNonExtensionField(const struct upb_Message *, const upb_MiniTableField *, const void *, void *)"
                     );
      }
      uVar3 = f->presence;
      if ((short)uVar3 < 0) {
        if (*(uint32_t *)((long)&msg->field_0 + (ulong)(uVar3 ^ 0xffff)) !=
            f->number_dont_copy_me__upb_internal_use_only) {
          return (uintptr_t)default_val;
        }
      }
      else if (default_val != (upb_Message *)0x0) {
        if (uVar3 == 0) {
          __assert_fail("upb_MiniTableField_HasPresence(field)",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                        ,0xfa,
                        "bool upb_Message_HasBaseField(const struct upb_Message *, const upb_MiniTableField *)"
                       );
        }
        if ((*(byte *)((long)&msg->field_0 + (ulong)(uVar3 >> 3)) >> (uVar3 & 7) & 1) == 0) {
          return (uintptr_t)default_val;
        }
      }
      return *(uintptr_t *)
              ((long)&msg->field_0 + (ulong)f->offset_dont_copy_me__upb_internal_use_only);
    }
  }
  else if ((bVar1 != 5) && (bVar1 != 0xc)) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_table/internal/field.h"
                  ,0x7b,"upb_FieldType upb_MiniTableField_Type(const struct upb_MiniTableField *)");
  }
  __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Message",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x1bd,
                "uintptr_t upb_Message_GetTaggedMessagePtr(const struct upb_Message *, const upb_MiniTableField *, struct upb_Message *)"
               );
}

Assistant:

UPB_API_INLINE uintptr_t upb_Message_GetTaggedMessagePtr(
    const struct upb_Message* msg, const upb_MiniTableField* f,
    struct upb_Message* default_val) {
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_Message);
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(f) ==
             UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte));
  UPB_ASSUME(upb_MiniTableField_IsScalar(f));
  uintptr_t tagged;
  _upb_Message_GetNonExtensionField(msg, f, &default_val, &tagged);
  return tagged;
}